

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_AfterMaximumKnownEditionErrorExperimentalEditions_Test::
~CommandLineInterfaceTest_AfterMaximumKnownEditionErrorExperimentalEditions_Test
          (CommandLineInterfaceTest_AfterMaximumKnownEditionErrorExperimentalEditions_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       AfterMaximumKnownEditionErrorExperimentalEditions) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "99997_TEST_ONLY";
    package foo;
    message Foo {
    }
  )schema");

  Run("protocol_compiler --experimental_editions --proto_path=$tmpdir "
      "--test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "foo.proto:2:5: Edition 99997_TEST_ONLY is later than the maximum "
      "supported edition 2024\n");
}